

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O1

JointObservationHistoryTree * __thiscall
PlanningUnitMADPDiscrete::GetJointObservationHistoryTree(PlanningUnitMADPDiscrete *this,Index johI)

{
  pointer ppJVar1;
  ulong uVar2;
  ostream *poVar3;
  JointObservationHistoryTree *pJVar4;
  
  uVar2 = (ulong)johI;
  if (uVar2 < this->_m_nrJointObservationHistories) {
    ppJVar1 = (this->_m_jointObservationHistoryTreeVector).
              super__Vector_base<JointObservationHistoryTree_*,_std::allocator<JointObservationHistoryTree_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->_m_jointObservationHistoryTreeVector).
                      super__Vector_base<JointObservationHistoryTree_*,_std::allocator<JointObservationHistoryTree_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppJVar1 >> 3) <= uVar2) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar2);
    }
    pJVar4 = ppJVar1[uVar2];
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "PlanningUnitMADPDiscrete::GetJointObservationHistoryTree - Warning: ",0x44);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"index (",7);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")out of bound!",0xe);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    pJVar4 = (JointObservationHistoryTree *)0x0;
  }
  return pJVar4;
}

Assistant:

JointObservationHistoryTree* PlanningUnitMADPDiscrete::
    GetJointObservationHistoryTree(Index johI) const
{
    if(johI < _m_nrJointObservationHistories)
        return(_m_jointObservationHistoryTreeVector.at(johI));
    else
    {
    cerr << "PlanningUnitMADPDiscrete::GetJointObservationHistoryTree - Warning: "<<
        "index (" << johI <<")out of bound!" << endl;
    return(0);
    }
}